

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

Real __thiscall
amrex::LineDistFcnElement2d::cpside(LineDistFcnElement2d *this,RealVect pt,RealVect *cpmin)

{
  pointer pdVar1;
  double dVar2;
  ulong uVar3;
  pointer pdVar4;
  LineDistFcnElement2d *this_00;
  long lVar5;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  Real dist;
  RealVect cp;
  
  cp.vect[0] = 0.0;
  cp.vect[1] = 0.0;
  cp.vect[2] = 0.0;
  pdVar4 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pdVar4;
  local_58 = 1e+29;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_78 = 0.0;
  this_00 = this;
  for (lVar5 = 1; lVar5 < (int)(uVar3 >> 3); lVar5 = lVar5 + 1) {
    pdVar1 = (this->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    single_seg_cpdist(this_00,pt,pdVar4[lVar5 + -1],pdVar4[lVar5],pdVar1[lVar5 + -1],pdVar1[lVar5],
                      &cp,&dist);
    if (dist < local_58) {
      cpmin->vect[2] = cp.vect[2];
      cpmin->vect[0] = cp.vect[0];
      cpmin->vect[1] = cp.vect[1];
      pdVar4 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (this->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78 = pdVar4[lVar5 + -1];
      local_68 = pdVar4[lVar5];
      local_70 = pdVar1[lVar5 + -1];
      local_60 = pdVar1[lVar5];
      local_58 = dist;
    }
  }
  dVar2 = (pt.vect[0] - cpmin->vect[0]) * (local_60 - local_70) -
          (pt.vect[1] - cpmin->vect[1]) * (local_68 - local_78);
  uVar3 = -(ulong)(dVar2 < 0.0);
  return (Real)(uVar3 & 0x3ff0000000000000 |
               (ulong)(~(uint)(uVar3 >> 0x20) & (uint)(-(ulong)(0.0 < dVar2) >> 0x20) & 0xbff00000)
               << 0x20);
}

Assistant:

amrex::Real LineDistFcnElement2d::cpside(amrex::RealVect pt,
                                         amrex::RealVect & cpmin) const {

  amrex::Real mindist, dist;
  mindist = 1.0e29;
  amrex::RealVect cp;
  amrex::RealVect l0, l1;

  for (int i=1, N=control_points_x.size(); i<N; ++i) {
    single_seg_cpdist(pt,
                      control_points_x[i-1], control_points_x[i],
                      control_points_y[i-1], control_points_y[i],
                      cp, dist);
    if (dist < mindist) {
      mindist = dist;
      cpmin = cp;
      l0 = amrex::RealVect(AMREX_D_DECL(control_points_x[i-1], control_points_y[i-1],0.0));
      l1 = amrex::RealVect(AMREX_D_DECL(control_points_x[i], control_points_y[i],0.0));
    }
  }

  //amrex::RealVect B = l1 - cpmin;
  amrex::RealVect B = l1 - l0;
  amrex::RealVect A = pt - cpmin;
  amrex::Real AcrossB = A[0]*B[1] - A[1]*B[0];

  if (AcrossB < 0.0) {
    return 1.0;
  } else if (AcrossB > 0.0) {
    return -1.0;
  } else {
    return 0.0;
    /*
    // AcrossB is zero, try extending line segment
    if (B[0]*B[0] + B[1]*B[1] != 0.0) {
      amrex::RealVect cext = amrex::RealVect(l1 - l0)*1.05 + l0;
      B = cext - cpmin;
      AcrossB = A[0]*B[1] - A[1]*B[0];
      if (AcrossB < 0.0) {
        return 1.0;
      } else if (AcrossB > 0.0) {
        return -1.0;
      }
    } else {
        // Point must be on the line, put it inside
        return 0.0;
    }
    */
  }
}